

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcd.c
# Opt level: O1

OPJ_BOOL opj_tcd_encode_tile(opj_tcd_t *p_tcd,OPJ_UINT32 p_tile_no,OPJ_BYTE *p_dest,
                            OPJ_UINT32 *p_data_written,OPJ_UINT32 p_max_length,
                            opj_codestream_info_t *p_cstr_info,opj_tcd_marker_info_t *p_marker_info,
                            opj_event_mgr_t *p_manager)

{
  OPJ_FLOAT32 OVar1;
  int iVar2;
  J2K_QUALITY_LAYER_ALLOCATION_STRATEGY JVar3;
  opj_tile_info_t *poVar4;
  opj_tcd_tile_t *poVar5;
  OPJ_INT32 *pOVar6;
  opj_image_comp_t *poVar7;
  opj_tcd_precinct_t *poVar8;
  opj_tcd_cblk_enc_t *poVar9;
  opj_tcd_pass_t *poVar10;
  undefined1 auVar11 [16];
  double dVar12;
  opj_tcd_resolution_t *thresh;
  undefined1 auVar13 [16];
  OPJ_FLOAT64 OVar14;
  double dVar15;
  bool bVar16;
  opj_tcd_resolution_t *poVar17;
  opj_tcd_resolution_t *poVar18;
  OPJ_BOOL OVar19;
  uint uVar20;
  int iVar21;
  opj_t2_t *poVar22;
  opj_packet_info_t *poVar23;
  opj_tccp_t *poVar24;
  OPJ_BYTE **pData;
  ulong uVar25;
  OPJ_FLOAT64 *mct_norms;
  ulong uVar26;
  double *pdVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  opj_tcd_tilecomp_t *poVar32;
  ulong uVar33;
  OPJ_UINT32 OVar34;
  OPJ_SIZE_T n;
  OPJ_INT32 (*paOVar35) [3];
  int iVar36;
  OPJ_UINT32 *pOVar37;
  OPJ_INT32 (*paOVar38) [3];
  long lVar39;
  ulong uVar40;
  ulong uVar41;
  long lVar42;
  int iVar43;
  ulong uVar44;
  OPJ_INT32 **ppOVar45;
  opj_tcd_tile_t *l_tile;
  ulong uVar46;
  int *piVar47;
  opj_tcp_t *poVar48;
  bool bVar49;
  float fVar50;
  undefined4 uVar51;
  undefined4 uVar52;
  opj_tcd_resolution_t *poVar53;
  undefined1 auVar54 [16];
  undefined4 uVar55;
  undefined4 uVar56;
  opj_tcd_resolution_t *poVar57;
  opj_tcd_resolution_t *poVar58;
  opj_tcd_resolution_t *poVar59;
  double dVar60;
  double dVar61;
  undefined4 local_598;
  undefined4 uStack_594;
  double local_580;
  opj_tcd_resolution_t *local_578;
  undefined8 uStack_570;
  OPJ_UINT32 local_53c;
  ulong local_538;
  opj_tcd_resolution_t *local_530;
  opj_cp_t *local_528;
  opj_tcd_resolution_t *local_520;
  opj_tcp_t *local_518;
  OPJ_BYTE *local_510;
  OPJ_UINT32 *local_508;
  opj_tcd_tile_t *tcd_tile;
  undefined8 local_4f8;
  opj_tcd_tilecomp_t *local_4f0;
  OPJ_INT32 matrice [10] [10] [3];
  
  uVar25 = (ulong)p_max_length;
  local_510 = p_dest;
  if (p_tcd->cur_tp_num == 0) {
    p_tcd->tcd_tileno = p_tile_no;
    poVar48 = p_tcd->cp->tcps + p_tile_no;
    p_tcd->tcp = poVar48;
    if (p_cstr_info != (opj_codestream_info_t *)0x0) {
      poVar32 = p_tcd->tcd_image->tiles->comps;
      uVar33 = 0;
      if (poVar32->numresolutions != 0) {
        poVar24 = poVar48->tccps;
        poVar4 = p_cstr_info->tile;
        pOVar37 = &poVar32->resolutions->ph;
        uVar41 = 0;
        do {
          poVar4[p_tile_no].pw[uVar41] = pOVar37[-1];
          poVar4[p_tile_no].ph[uVar41] = *pOVar37;
          uVar20 = (int)uVar33 + *pOVar37 * pOVar37[-1];
          uVar33 = (ulong)uVar20;
          poVar4[p_tile_no].pdx[uVar41] = poVar24->prcw[uVar41];
          poVar4[p_tile_no].pdy[uVar41] = poVar24->prch[uVar41];
          uVar41 = uVar41 + 1;
          pOVar37 = pOVar37 + 0x30;
        } while (uVar41 < poVar32->numresolutions);
        uVar33 = (ulong)uVar20;
      }
      poVar23 = (opj_packet_info_t *)
                opj_calloc((long)p_cstr_info->numlayers * (long)p_cstr_info->numcomps * uVar33,0x20)
      ;
      p_cstr_info->tile[p_tile_no].packet = poVar23;
      if (poVar23 == (opj_packet_info_t *)0x0) {
        return 0;
      }
    }
    poVar5 = p_tcd->tcd_image->tiles;
    if (poVar5->numcomps != 0) {
      poVar24 = p_tcd->tcp->tccps;
      poVar32 = poVar5->comps;
      uVar20 = 0;
      do {
        pOVar6 = poVar32->data;
        lVar39 = (long)(poVar32->y1 - poVar32->y0) * (long)(poVar32->x1 - poVar32->x0);
        if (poVar24->qmfbid == 1) {
          if (lVar39 != 0) {
            lVar42 = 0;
            do {
              pOVar6[lVar42] = pOVar6[lVar42] - poVar24->m_dc_level_shift;
              lVar42 = lVar42 + 1;
            } while (lVar39 - lVar42 != 0);
          }
        }
        else if (lVar39 != 0) {
          iVar21 = poVar24->m_dc_level_shift;
          lVar42 = 0;
          do {
            pOVar6[lVar42] = (OPJ_INT32)(float)(pOVar6[lVar42] - iVar21);
            lVar42 = lVar42 + 1;
          } while (lVar39 - lVar42 != 0);
        }
        poVar24 = poVar24 + 1;
        poVar32 = poVar32 + 1;
        uVar20 = uVar20 + 1;
      } while (uVar20 < poVar5->numcomps);
    }
    poVar48 = p_tcd->tcp;
    local_538 = uVar25;
    local_508 = p_data_written;
    if (poVar48->mct != 0) {
      poVar32 = poVar5->comps;
      n = ((long)poVar32->y1 - (long)poVar32->y0) * ((long)poVar32->x1 - (long)poVar32->x0);
      if (poVar48->mct == 2) {
        if (poVar48->m_mct_coding_matrix != (OPJ_FLOAT32 *)0x0) {
          pData = (OPJ_BYTE **)opj_malloc((ulong)poVar5->numcomps << 3);
          if (pData == (OPJ_BYTE **)0x0) {
            return 0;
          }
          uVar20 = poVar5->numcomps;
          if ((ulong)uVar20 != 0) {
            ppOVar45 = &poVar32->data;
            uVar25 = 0;
            do {
              pData[uVar25] = (OPJ_BYTE *)*ppOVar45;
              uVar25 = uVar25 + 1;
              ppOVar45 = ppOVar45 + 0xe;
            } while (uVar20 != uVar25);
          }
          OVar19 = opj_mct_encode_custom
                             ((OPJ_BYTE *)p_tcd->tcp->m_mct_coding_matrix,n,pData,uVar20,
                              p_tcd->image->comps->sgnd);
          opj_free(pData);
          if (OVar19 == 0) {
            return 0;
          }
        }
      }
      else if (poVar48->tccps->qmfbid == 0) {
        opj_mct_encode_real((OPJ_FLOAT32 *)poVar32->data,(OPJ_FLOAT32 *)poVar32[1].data,
                            (OPJ_FLOAT32 *)poVar32[2].data,n);
      }
      else {
        opj_mct_encode(poVar32->data,poVar32[1].data,poVar32[2].data,n);
      }
    }
    poVar5 = p_tcd->tcd_image->tiles;
    if (poVar5->numcomps != 0) {
      poVar32 = poVar5->comps;
      pOVar37 = &p_tcd->tcp->tccps->qmfbid;
      uVar20 = 0;
      do {
        if (*pOVar37 == 0) {
          iVar21 = opj_dwt_encode_real(p_tcd,poVar32);
LAB_001429e6:
          if (iVar21 == 0) {
            return 0;
          }
        }
        else if (*pOVar37 == 1) {
          iVar21 = opj_dwt_encode(p_tcd,poVar32);
          goto LAB_001429e6;
        }
        poVar32 = poVar32 + 1;
        uVar20 = uVar20 + 1;
        pOVar37 = pOVar37 + 0x10e;
      } while (uVar20 < poVar5->numcomps);
    }
    poVar48 = p_tcd->tcp;
    if (poVar48->mct == 1) {
      OVar34 = 3;
      if (poVar48->tccps->qmfbid == 0) {
        mct_norms = opj_mct_get_mct_norms_real();
      }
      else {
        mct_norms = opj_mct_get_mct_norms();
      }
    }
    else {
      OVar34 = p_tcd->image->numcomps;
      mct_norms = poVar48->mct_norms;
    }
    OVar19 = opj_t1_encode_cblks(p_tcd,p_tcd->tcd_image->tiles,poVar48,mct_norms,OVar34);
    if (OVar19 == 0) {
      return 0;
    }
    local_528 = p_tcd->cp;
    local_53c = 0;
    if (p_cstr_info != (opj_codestream_info_t *)0x0) {
      p_cstr_info->index_write = 0;
    }
    if ((local_528->m_specific_param).m_enc.m_quality_layer_alloc_strategy < FIXED_LAYER) {
      poVar48 = p_tcd->tcp;
      poVar5 = p_tcd->tcd_image->tiles;
      poVar5->numpix = 0;
      uVar20 = poVar5->numcomps;
      if ((ulong)uVar20 == 0) {
        local_530 = (opj_tcd_resolution_t *)0x7fefffffffffffff;
        local_580 = 0.0;
        local_520 = (opj_tcd_resolution_t *)0x0;
      }
      else {
        poVar32 = poVar5->comps;
        poVar7 = p_tcd->image->comps;
        local_520 = (opj_tcd_resolution_t *)0x0;
        local_530 = (opj_tcd_resolution_t *)0x7fefffffffffffff;
        uVar25 = 0;
        local_580 = 0.0;
        do {
          poVar32[uVar25].numpix = 0;
          uVar30 = poVar32[uVar25].numresolutions;
          if ((ulong)uVar30 != 0) {
            poVar53 = poVar32[uVar25].resolutions;
            uVar33 = 0;
            do {
              uVar31 = poVar53[uVar33].numbands;
              if ((ulong)uVar31 != 0) {
                uVar41 = 0;
                do {
                  if (((poVar53[uVar33].bands[uVar41].x1 != poVar53[uVar33].bands[uVar41].x0) &&
                      (poVar53[uVar33].bands[uVar41].y1 != poVar53[uVar33].bands[uVar41].y0)) &&
                     (uVar28 = poVar53[uVar33].ph * poVar53[uVar33].pw, uVar28 != 0)) {
                    poVar8 = poVar53[uVar33].bands[uVar41].precincts;
                    uVar26 = 0;
                    do {
                      uVar29 = poVar8[uVar26].ch * poVar8[uVar26].cw;
                      if (uVar29 != 0) {
                        uVar40 = 0;
                        do {
                          poVar9 = poVar8[uVar26].cblks.enc;
                          if ((ulong)poVar9[uVar40].totalpasses != 0) {
                            poVar10 = poVar9[uVar40].passes;
                            lVar39 = 0;
                            poVar57 = local_520;
                            poVar58 = local_530;
                            do {
                              iVar21 = *(int *)((long)&poVar10->rate + lVar39);
                              if (lVar39 == 0) {
                                OVar14 = poVar10->distortiondec;
                              }
                              else {
                                iVar21 = iVar21 - *(int *)((long)&poVar10[-1].rate + lVar39);
                                OVar14 = (OPJ_FLOAT64)
                                         (*(double *)((long)&poVar10->distortiondec + lVar39) -
                                         *(double *)((long)poVar10 + lVar39 + -0x10));
                              }
                              local_520 = poVar57;
                              local_530 = poVar58;
                              if (iVar21 != 0) {
                                local_520 = (opj_tcd_resolution_t *)
                                            ((double)OVar14 / (double)iVar21);
                                local_530 = local_520;
                                if ((double)poVar58 <= (double)local_520) {
                                  local_530 = poVar58;
                                }
                                if ((double)local_520 <= (double)poVar57) {
                                  local_520 = poVar57;
                                }
                              }
                              lVar39 = lVar39 + 0x18;
                              poVar57 = local_520;
                              poVar58 = local_530;
                            } while ((ulong)poVar9[uVar40].totalpasses * 0x18 != lVar39);
                          }
                          lVar39 = (long)((poVar9[uVar40].y1 - poVar9[uVar40].y0) *
                                         (poVar9[uVar40].x1 - poVar9[uVar40].x0));
                          poVar5->numpix = poVar5->numpix + lVar39;
                          poVar32[uVar25].numpix = poVar32[uVar25].numpix + lVar39;
                          uVar40 = uVar40 + 1;
                        } while (uVar40 != uVar29);
                      }
                      uVar26 = uVar26 + 1;
                    } while (uVar26 != uVar28);
                  }
                  uVar41 = uVar41 + 1;
                } while (uVar41 != uVar31);
              }
              uVar33 = uVar33 + 1;
            } while (uVar33 != uVar30);
          }
          dVar15 = (double)(1 << ((byte)poVar7[uVar25].prec & 0x1f)) + -1.0;
          local_580 = local_580 +
                      (((double)CONCAT44(0x45300000,(int)(poVar32[uVar25].numpix >> 0x20)) -
                       1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)poVar32[uVar25].numpix) - 4503599627370496.0
                      )) * dVar15 * dVar15;
          uVar25 = uVar25 + 1;
        } while (uVar25 != uVar20);
      }
      local_518 = poVar48;
      if (p_cstr_info != (opj_codestream_info_t *)0x0) {
        poVar4 = p_cstr_info->tile;
        uVar20 = p_tcd->tcd_tileno;
        poVar4[uVar20].numpix = (int)poVar5->numpix;
        poVar4[uVar20].distotile = (double)(int)(double)poVar5->distotile;
        pdVar27 = (double *)opj_malloc((ulong)poVar48->numlayers << 3);
        poVar4[uVar20].thresh = pdVar27;
        if (pdVar27 == (double *)0x0) {
          return 0;
        }
      }
      p_data_written = local_508;
      uVar25 = local_538;
      if (poVar48->numlayers != 0) {
        uVar41 = 0;
        uVar33 = local_538;
        do {
          uVar30 = (uint)uVar33;
          uVar20 = uVar30;
          if (0.0 < (float)poVar48->rates[uVar41]) {
            fVar50 = ceilf((float)poVar48->rates[uVar41]);
            uVar20 = (uint)(long)fVar50;
            if (uVar30 <= (uint)(long)fVar50) {
              uVar20 = uVar30;
            }
          }
          dVar15 = (double)poVar5->distotile;
          dVar12 = pow(10.0,(double)((float)poVar48->distoratio[uVar41] / 10.0));
          JVar3 = (local_528->m_specific_param).m_enc.m_quality_layer_alloc_strategy;
          OVar34 = (OPJ_UINT32)uVar41;
          if (JVar3 == FIXED_DISTORTION_RATIO) {
            local_598 = 0;
            uStack_594 = 0xbff00000;
            if (0.0 < (float)poVar48->distoratio[uVar41]) {
LAB_00143235:
              poVar22 = opj_t2_create(p_tcd->image,local_528);
              if (poVar22 == (opj_t2_t *)0x0) {
                local_598 = 0;
                uStack_594 = 0;
              }
              else {
                poVar53 = (opj_tcd_resolution_t *)0x0;
                uVar55 = 0;
                uVar56 = 0;
                bVar16 = false;
                local_578 = (opj_tcd_resolution_t *)0x0;
                uStack_570 = 0;
                uVar25 = 0;
                poVar57 = local_530;
                poVar58 = local_520;
                uVar30 = 0;
                do {
                  uVar51 = (undefined4)uVar25;
                  uVar52 = (undefined4)(uVar25 >> 0x20);
                  thresh = (opj_tcd_resolution_t *)(((double)poVar58 + (double)poVar57) * 0.5);
                  dVar60 = (double)thresh - (double)poVar53;
                  dVar61 = (double)poVar53 * 5e-06;
                  poVar59 = poVar58;
                  poVar18 = local_578;
                  if (dVar61 < ABS(dVar60)) {
                    auVar11._8_4_ = uVar51;
                    auVar11._0_8_ = thresh;
                    auVar11._12_4_ = uVar52;
                    OVar19 = opj_tcd_makelayer(p_tcd,OVar34,(OPJ_FLOAT64)thresh,0);
                    uVar55 = uVar51;
                    uVar56 = uVar52;
                    poVar53 = thresh;
                    if ((local_528->m_specific_param).m_enc.m_quality_layer_alloc_strategy ==
                        FIXED_DISTORTION_RATIO) {
                      if ((ushort)((short)*(int *)local_528 - 3U) < 4 ||
                          (*(int *)local_528 - 0x400U & 0xffff) < 0x59c) {
                        OVar19 = opj_t2_encode_packets
                                           (poVar22,p_tcd->tcd_tileno,poVar5,OVar34 + 1,local_510,
                                            &local_53c,uVar20,p_cstr_info,
                                            (opj_tcd_marker_info_t *)0x0,p_tcd->cur_tp_num,
                                            p_tcd->tp_pos,p_tcd->cur_pino,THRESH_CALC,p_manager);
                        if (OVar19 == 0) goto LAB_001434ee;
                        if (uVar41 == 0) {
                          OVar14 = poVar5->distolayer[0];
                        }
                        else {
                          OVar14 = (OPJ_FLOAT64)
                                   (*(double *)(matrice[0][0] + (ulong)(OVar34 - 1) * 2) +
                                   (double)poVar5->distolayer[uVar41]);
                        }
                      }
                      else if (uVar41 == 0) {
                        OVar14 = poVar5->distolayer[0];
                      }
                      else {
                        OVar14 = (OPJ_FLOAT64)
                                 (*(double *)(matrice[0][0] + (ulong)(OVar34 - 1) * 2) +
                                 (double)poVar5->distolayer[uVar41]);
                      }
                      uVar51 = (undefined4)uStack_570;
                      uVar52 = uStack_570._4_4_;
                      poVar59 = thresh;
                      uVar33 = 0;
                      poVar18 = thresh;
                      uStack_570 = uVar25;
                      poVar17 = thresh;
                      if (dVar15 - local_580 / dVar12 <= (double)OVar14) {
LAB_00143556:
                        uVar25 = uVar33;
                        uStack_570 = CONCAT44(uVar52,uVar51);
                        poVar57 = poVar17;
                        poVar59 = poVar58;
                        poVar18 = local_578;
                      }
                    }
                    else if (bVar16 || (uVar30 == 0 || OVar19 == 0)) {
                      bVar16 = true;
                      poVar58 = thresh;
                      uVar33 = auVar11._8_8_;
                      local_578 = thresh;
                      poVar17 = poVar57;
                      if ((uVar30 != 0 && OVar19 != 0) ||
                         (OVar19 = opj_t2_encode_packets
                                             (poVar22,p_tcd->tcd_tileno,poVar5,OVar34 + 1,local_510,
                                              &local_53c,uVar20,p_cstr_info,
                                              (opj_tcd_marker_info_t *)0x0,p_tcd->cur_tp_num,
                                              p_tcd->tp_pos,p_tcd->cur_pino,THRESH_CALC,p_manager),
                         OVar19 != 0)) goto LAB_00143556;
                      bVar16 = false;
                      uVar25 = 0;
                      poVar57 = thresh;
                    }
                    else {
                      bVar16 = false;
LAB_001434ee:
                      uVar25 = 0;
                      poVar57 = thresh;
                    }
                  }
                  local_578 = poVar18;
                } while ((dVar61 < ABS(dVar60)) &&
                        (bVar49 = uVar30 < 0x7f, poVar58 = poVar59, uVar30 = uVar30 + 1, bVar49));
                uStack_570 = CONCAT44(uVar56,uVar55) & uStack_570;
                auVar54._0_8_ = ~-(ulong)((double)local_578 == 0.0) & (ulong)local_578;
                auVar54._8_8_ = 0;
                auVar13._8_4_ = (int)uStack_570;
                auVar13._0_8_ = (ulong)poVar53 & -(ulong)((double)local_578 == 0.0);
                auVar13._12_4_ = (int)(uStack_570 >> 0x20);
                opj_t2_destroy(poVar22);
                local_598 = SUB164(auVar54 | auVar13,0);
                uStack_594 = SUB164(auVar54 | auVar13,4);
                uVar33 = local_538;
                poVar48 = local_518;
              }
              if (poVar22 == (opj_t2_t *)0x0) {
                return 0;
              }
            }
          }
          else {
            local_598 = 0;
            uStack_594 = 0xbff00000;
            if (JVar3 == RATE_DISTORTION_RATIO) {
              if (0.0 < (float)poVar48->rates[uVar41]) goto LAB_00143235;
              local_598 = 0;
              uStack_594 = 0xbff00000;
            }
          }
          if (p_cstr_info != (opj_codestream_info_t *)0x0) {
            p_cstr_info->tile[p_tcd->tcd_tileno].thresh[uVar41] =
                 (double)CONCAT44(uStack_594,local_598);
          }
          opj_tcd_makelayer(p_tcd,OVar34,(OPJ_FLOAT64)CONCAT44(uStack_594,local_598),1);
          if (uVar41 == 0) {
            OVar14 = poVar5->distolayer[0];
          }
          else {
            OVar14 = (OPJ_FLOAT64)
                     (*(double *)(matrice[-1][9] + uVar41 * 2 + 1) +
                     (double)poVar5->distolayer[uVar41]);
          }
          *(OPJ_FLOAT64 *)(matrice[0][0] + uVar41 * 2) = OVar14;
          uVar41 = uVar41 + 1;
          p_data_written = local_508;
          uVar25 = local_538;
        } while (uVar41 < poVar48->numlayers);
      }
    }
    else {
      uVar33 = (ulong)p_tcd->tcp->numlayers;
      p_data_written = local_508;
      uVar25 = local_538;
      if (uVar33 != 0) {
        tcd_tile = p_tcd->tcd_image->tiles;
        local_530 = (opj_tcd_resolution_t *)(ulong)tcd_tile->numcomps;
        uVar41 = 0;
        do {
          if (local_530 != (opj_tcd_resolution_t *)0x0) {
            local_4f0 = tcd_tile->comps;
            local_518 = (opj_tcp_t *)(matrice + ((int)uVar41 - 1));
            poVar53 = (opj_tcd_resolution_t *)0x0;
            do {
              uVar20 = local_4f0[(long)poVar53].numresolutions;
              uVar26 = (ulong)uVar20;
              iVar21 = 0;
              paOVar38 = matrice[0];
              uVar40 = 0;
              do {
                if (uVar26 != 0) {
                  uVar30 = p_tcd->image->comps[(long)poVar53].prec;
                  pOVar6 = (local_528->m_specific_param).m_enc.m_matrice;
                  uVar46 = 0;
                  paOVar35 = paOVar38;
                  iVar36 = iVar21;
                  do {
                    lVar39 = 0;
                    do {
                      (*(OPJ_INT32 (*) [3])*paOVar35)[lVar39] =
                           (int)((float)pOVar6[(uint)(iVar36 + (int)lVar39)] *
                                (float)((double)uVar30 * 0.0625));
                      lVar39 = lVar39 + 1;
                    } while (lVar39 != 3);
                    uVar46 = uVar46 + 1;
                    paOVar35 = paOVar35 + 1;
                    iVar36 = iVar36 + 3;
                  } while (uVar46 != uVar26);
                }
                uVar40 = uVar40 + 1;
                paOVar38 = paOVar38 + 10;
                iVar21 = iVar21 + uVar20 * 3;
              } while (uVar40 != uVar33);
              if (uVar26 != 0) {
                local_520 = local_4f0[(long)poVar53].resolutions;
                uVar40 = 0;
                do {
                  uVar20 = local_520[uVar40].numbands;
                  if ((ulong)uVar20 != 0) {
                    uVar46 = 0;
                    do {
                      if (((local_520[uVar40].bands[uVar46].x1 != local_520[uVar40].bands[uVar46].x0
                           ) && (local_520[uVar40].bands[uVar46].y1 !=
                                 local_520[uVar40].bands[uVar46].y0)) &&
                         (uVar30 = local_520[uVar40].ph * local_520[uVar40].pw, uVar30 != 0)) {
                        poVar8 = local_520[uVar40].bands[uVar46].precincts;
                        uVar44 = 0;
                        do {
                          uVar31 = poVar8[uVar44].ch * poVar8[uVar44].cw;
                          if (uVar31 != 0) {
                            OVar34 = p_tcd->image->comps[(long)poVar53].prec;
                            iVar21 = matrice[uVar41][uVar40][uVar46];
                            lVar39 = 0;
                            do {
                              poVar9 = poVar8[uVar44].cblks.enc;
                              iVar36 = OVar34 - *(int *)((long)&poVar9->numbps + lVar39);
                              if (uVar41 == 0) {
                                iVar43 = iVar21 - iVar36;
                                if (iVar21 - iVar36 == 0 || iVar21 < iVar36) {
                                  iVar43 = 0;
                                }
                              }
                              else {
                                OVar1 = local_518->rates[uVar40 * 3 + (uVar46 - 5)];
                                iVar43 = iVar21 - (int)OVar1;
                                if (((int)OVar1 - iVar36 == 0 || (int)OVar1 < iVar36) &&
                                   (iVar43 = ((int)OVar1 - iVar36) + (iVar21 - (int)OVar1),
                                   iVar43 < 1)) {
                                  iVar43 = 0;
                                }
                              }
                              if (uVar41 == 0) {
                                *(undefined4 *)((long)&poVar9->numpassesinlayers + lVar39) = 0;
                              }
                              iVar36 = *(int *)((long)&poVar9->numpassesinlayers + lVar39);
                              if (iVar36 == 0) {
                                if (iVar43 == 0) {
                                  iVar43 = 0;
                                }
                                else {
                                  iVar43 = iVar43 * 3 + -2;
                                }
                              }
                              else {
                                iVar43 = iVar43 * 3 + iVar36;
                              }
                              piVar47 = (int *)(uVar41 * 0x18 +
                                               *(long *)((long)&poVar9->layers + lVar39));
                              *piVar47 = iVar43 - iVar36;
                              if (iVar43 - iVar36 != 0) {
                                lVar42 = *(long *)((long)&poVar9->passes + lVar39);
                                iVar2 = *(int *)(lVar42 + (ulong)(iVar43 - 1) * 0x18);
                                if (iVar36 == 0) {
                                  piVar47[1] = iVar2;
                                  lVar42 = *(long *)((long)&poVar9->data + lVar39);
                                }
                                else {
                                  uVar28 = *(uint *)(lVar42 + (ulong)(iVar36 - 1) * 0x18);
                                  piVar47[1] = iVar2 - uVar28;
                                  lVar42 = (ulong)uVar28 + *(long *)((long)&poVar9->data + lVar39);
                                }
                                *(long *)(piVar47 + 4) = lVar42;
                                *(int *)((long)&poVar9->numpassesinlayers + lVar39) = iVar43;
                              }
                              lVar39 = lVar39 + 0x40;
                            } while ((ulong)uVar31 << 6 != lVar39);
                          }
                          uVar44 = uVar44 + 1;
                        } while (uVar44 != uVar30);
                      }
                      uVar46 = uVar46 + 1;
                    } while (uVar46 != uVar20);
                  }
                  uVar40 = uVar40 + 1;
                } while (uVar40 != uVar26);
              }
              poVar53 = (opj_tcd_resolution_t *)((long)&poVar53->x0 + 1);
            } while (poVar53 != local_530);
          }
          uVar41 = uVar41 + 1;
          local_4f8 = uVar33;
        } while (uVar41 != uVar33);
      }
    }
  }
  if (p_cstr_info != (opj_codestream_info_t *)0x0) {
    p_cstr_info->index_write = 1;
  }
  poVar22 = opj_t2_create(p_tcd->image,p_tcd->cp);
  if (poVar22 == (opj_t2_t *)0x0) {
    return 0;
  }
  OVar19 = opj_t2_encode_packets
                     (poVar22,p_tcd->tcd_tileno,p_tcd->tcd_image->tiles,p_tcd->tcp->numlayers,
                      local_510,p_data_written,(OPJ_UINT32)uVar25,p_cstr_info,p_marker_info,
                      p_tcd->tp_num,p_tcd->tp_pos,p_tcd->cur_pino,FINAL_PASS,p_manager);
  opj_t2_destroy(poVar22);
  return (uint)(OVar19 != 0);
}

Assistant:

OPJ_BOOL opj_tcd_encode_tile(opj_tcd_t *p_tcd,
                             OPJ_UINT32 p_tile_no,
                             OPJ_BYTE *p_dest,
                             OPJ_UINT32 * p_data_written,
                             OPJ_UINT32 p_max_length,
                             opj_codestream_info_t *p_cstr_info,
                             opj_tcd_marker_info_t* p_marker_info,
                             opj_event_mgr_t *p_manager)
{

    if (p_tcd->cur_tp_num == 0) {

        p_tcd->tcd_tileno = p_tile_no;
        p_tcd->tcp = &p_tcd->cp->tcps[p_tile_no];

        /* INDEX >> "Precinct_nb_X et Precinct_nb_Y" */
        if (p_cstr_info)  {
            OPJ_UINT32 l_num_packs = 0;
            OPJ_UINT32 i;
            opj_tcd_tilecomp_t *l_tilec_idx =
                &p_tcd->tcd_image->tiles->comps[0];        /* based on component 0 */
            opj_tccp_t *l_tccp = p_tcd->tcp->tccps; /* based on component 0 */

            for (i = 0; i < l_tilec_idx->numresolutions; i++) {
                opj_tcd_resolution_t *l_res_idx = &l_tilec_idx->resolutions[i];

                p_cstr_info->tile[p_tile_no].pw[i] = (int)l_res_idx->pw;
                p_cstr_info->tile[p_tile_no].ph[i] = (int)l_res_idx->ph;

                l_num_packs += l_res_idx->pw * l_res_idx->ph;
                p_cstr_info->tile[p_tile_no].pdx[i] = (int)l_tccp->prcw[i];
                p_cstr_info->tile[p_tile_no].pdy[i] = (int)l_tccp->prch[i];
            }
            p_cstr_info->tile[p_tile_no].packet = (opj_packet_info_t*) opj_calloc((
                    OPJ_SIZE_T)p_cstr_info->numcomps * (OPJ_SIZE_T)p_cstr_info->numlayers *
                                                  l_num_packs,
                                                  sizeof(opj_packet_info_t));
            if (!p_cstr_info->tile[p_tile_no].packet) {
                /* FIXME event manager error callback */
                return OPJ_FALSE;
            }
        }
        /* << INDEX */

        /* FIXME _ProfStart(PGROUP_DC_SHIFT); */
        /*---------------TILE-------------------*/
        if (! opj_tcd_dc_level_shift_encode(p_tcd)) {
            return OPJ_FALSE;
        }
        /* FIXME _ProfStop(PGROUP_DC_SHIFT); */

        /* FIXME _ProfStart(PGROUP_MCT); */
        if (! opj_tcd_mct_encode(p_tcd)) {
            return OPJ_FALSE;
        }
        /* FIXME _ProfStop(PGROUP_MCT); */

        /* FIXME _ProfStart(PGROUP_DWT); */
        if (! opj_tcd_dwt_encode(p_tcd)) {
            return OPJ_FALSE;
        }
        /* FIXME  _ProfStop(PGROUP_DWT); */

        /* FIXME  _ProfStart(PGROUP_T1); */
        if (! opj_tcd_t1_encode(p_tcd)) {
            return OPJ_FALSE;
        }
        /* FIXME _ProfStop(PGROUP_T1); */

        /* FIXME _ProfStart(PGROUP_RATE); */
        if (! opj_tcd_rate_allocate_encode(p_tcd, p_dest, p_max_length,
                                           p_cstr_info, p_manager)) {
            return OPJ_FALSE;
        }
        /* FIXME _ProfStop(PGROUP_RATE); */

    }
    /*--------------TIER2------------------*/

    /* INDEX */
    if (p_cstr_info) {
        p_cstr_info->index_write = 1;
    }
    /* FIXME _ProfStart(PGROUP_T2); */

    if (! opj_tcd_t2_encode(p_tcd, p_dest, p_data_written, p_max_length,
                            p_cstr_info, p_marker_info, p_manager)) {
        return OPJ_FALSE;
    }
    /* FIXME _ProfStop(PGROUP_T2); */

    /*---------------CLEAN-------------------*/

    return OPJ_TRUE;
}